

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_loongson_integer(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  uint uVar1;
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGLabel *pTVar2;
  TCGLabel *pTVar3;
  TCGLabel *l;
  uintptr_t o_1;
  uintptr_t o;
  
  if (rd == 0) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = opc + 0x83ffffe8;
  if (((uVar1 < 6) && ((0x33U >> (uVar1 & 0x1f) & 1) != 0)) || (opc + 0x8ffffff0 < 4)) {
    t = tcg_temp_new_i64(tcg_ctx);
    t_00 = tcg_temp_new_i64(tcg_ctx);
  }
  else {
    t = tcg_temp_local_new_i64(tcg_ctx);
    t_00 = tcg_temp_local_new_i64(tcg_ctx);
  }
  gen_load_gpr(tcg_ctx,t,rs);
  gen_load_gpr(tcg_ctx,t_00,rt);
  switch(opc) {
  case 0x70000010:
    goto switchD_0088b4e7_caseD_70000010;
  case 0x70000011:
  case 0x70000013:
switchD_0088b4e7_caseD_70000011:
    tcg_gen_mul_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t,t_00);
    goto switchD_0088b4e7_caseD_70000018;
  case 0x70000012:
switchD_0088b4e7_caseD_70000012:
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t_00,t_00);
    goto switchD_0088b4e7_caseD_70000010;
  case 0x70000014:
switchD_0088b4e7_caseD_70000014:
    pTVar3 = gen_new_label_mips64el(tcg_ctx);
    pTVar2 = gen_new_label_mips64el(tcg_ctx);
    l = gen_new_label_mips64el(tcg_ctx);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,t,t);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,t_00,t_00);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t_00,0,pTVar3);
    tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],0);
    tcg_gen_br(tcg_ctx,l);
    gen_set_label(tcg_ctx,pTVar3);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t,-0x80000000,pTVar2);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t_00,-1,pTVar2);
    tcg_gen_mov_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t);
    tcg_gen_br(tcg_ctx,l);
    gen_set_label(tcg_ctx,pTVar2);
    tcg_gen_div_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t,t_00);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],tcg_ctx->cpu_gpr[(uint)rd]);
    break;
  case 0x70000015:
switchD_0088b4e7_caseD_70000015:
    pTVar3 = gen_new_label_mips64el(tcg_ctx);
    pTVar2 = gen_new_label_mips64el(tcg_ctx);
    l = gen_new_label_mips64el(tcg_ctx);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t_00,0,pTVar3);
    tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],0);
    tcg_gen_br(tcg_ctx,l);
    gen_set_label(tcg_ctx,pTVar3);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t,-0x8000000000000000,pTVar2);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t_00,-1,pTVar2);
    tcg_gen_mov_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t);
    tcg_gen_br(tcg_ctx,l);
    gen_set_label(tcg_ctx,pTVar2);
    tcg_gen_div_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t,t_00);
    break;
  case 0x70000016:
switchD_0088b4e7_caseD_70000016:
    pTVar3 = gen_new_label_mips64el(tcg_ctx);
    l = gen_new_label_mips64el(tcg_ctx);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t_00,t_00);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t_00,0,pTVar3);
    tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],0);
    tcg_gen_br(tcg_ctx,l);
    gen_set_label(tcg_ctx,pTVar3);
    tcg_gen_divu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t,t_00);
    goto LAB_0088bab2;
  case 0x70000017:
switchD_0088b4e7_caseD_70000017:
    pTVar3 = gen_new_label_mips64el(tcg_ctx);
    l = gen_new_label_mips64el(tcg_ctx);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t_00,0,pTVar3);
    tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],0);
    tcg_gen_br(tcg_ctx,l);
    gen_set_label(tcg_ctx,pTVar3);
    tcg_gen_divu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t,t_00);
    break;
  case 0x70000018:
  case 0x70000019:
  case 0x7000001a:
  case 0x7000001b:
    goto switchD_0088b4e7_caseD_70000018;
  case 0x7000001c:
switchD_0088b4e7_caseD_7000001c:
    pTVar3 = gen_new_label_mips64el(tcg_ctx);
    pTVar2 = gen_new_label_mips64el(tcg_ctx);
    l = gen_new_label_mips64el(tcg_ctx);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t_00,t_00);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,t_00,0,pTVar3);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t,-0x80000000,pTVar2);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t_00,-1,pTVar2);
    gen_set_label(tcg_ctx,pTVar3);
    tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],0);
    tcg_gen_br(tcg_ctx,l);
    gen_set_label(tcg_ctx,pTVar2);
    tcg_gen_rem_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t,t_00);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],tcg_ctx->cpu_gpr[(uint)rd]);
    break;
  case 0x7000001d:
switchD_0088b4e7_caseD_7000001d:
    pTVar3 = gen_new_label_mips64el(tcg_ctx);
    pTVar2 = gen_new_label_mips64el(tcg_ctx);
    l = gen_new_label_mips64el(tcg_ctx);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,t_00,0,pTVar3);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t,-0x8000000000000000,pTVar2);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t_00,-1,pTVar2);
    gen_set_label(tcg_ctx,pTVar3);
    tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],0);
    tcg_gen_br(tcg_ctx,l);
    gen_set_label(tcg_ctx,pTVar2);
    tcg_gen_rem_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t,t_00);
    break;
  case 0x7000001e:
switchD_0088b4e7_caseD_7000001e:
    pTVar3 = gen_new_label_mips64el(tcg_ctx);
    l = gen_new_label_mips64el(tcg_ctx);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t_00,t_00);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t_00,0,pTVar3);
    tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],0);
    tcg_gen_br(tcg_ctx,l);
    gen_set_label(tcg_ctx,pTVar3);
    tcg_gen_remu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t,t_00);
LAB_0088bab2:
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],tcg_ctx->cpu_gpr[(uint)rd]);
    break;
  case 0x7000001f:
switchD_0088b4e7_caseD_7000001f:
    pTVar3 = gen_new_label_mips64el(tcg_ctx);
    l = gen_new_label_mips64el(tcg_ctx);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,t_00,0,pTVar3);
    tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],0);
    tcg_gen_br(tcg_ctx,l);
    gen_set_label(tcg_ctx,pTVar3);
    tcg_gen_remu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t,t_00);
    break;
  default:
    switch(uVar1) {
    case 0:
      goto switchD_0088b4e7_caseD_70000010;
    case 1:
      goto switchD_0088b4e7_caseD_70000012;
    case 2:
      goto switchD_0088b4e7_caseD_70000014;
    case 3:
      goto switchD_0088b4e7_caseD_70000016;
    case 4:
    case 5:
      goto switchD_0088b4e7_caseD_70000011;
    case 6:
      goto switchD_0088b4e7_caseD_70000015;
    case 7:
      goto switchD_0088b4e7_caseD_70000017;
    default:
      goto switchD_0088b4e7_caseD_70000018;
    case 10:
      goto switchD_0088b4e7_caseD_7000001c;
    case 0xb:
      goto switchD_0088b4e7_caseD_7000001e;
    case 0xe:
      goto switchD_0088b4e7_caseD_7000001d;
    case 0xf:
      goto switchD_0088b4e7_caseD_7000001f;
    }
  }
  gen_set_label(tcg_ctx,l);
switchD_0088b4e7_caseD_70000018:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  return;
switchD_0088b4e7_caseD_70000010:
  tcg_gen_mul_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t,t_00);
  tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],tcg_ctx->cpu_gpr[(uint)rd]);
  goto switchD_0088b4e7_caseD_70000018;
}

Assistant:

static void gen_loongson_integer(DisasContext *ctx, uint32_t opc,
                                 int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }

    switch (opc) {
    case OPC_MULT_G_2E:
    case OPC_MULT_G_2F:
    case OPC_MULTU_G_2E:
    case OPC_MULTU_G_2F:
#if defined(TARGET_MIPS64)
    case OPC_DMULT_G_2E:
    case OPC_DMULT_G_2F:
    case OPC_DMULTU_G_2E:
    case OPC_DMULTU_G_2F:
#endif
        t0 = tcg_temp_new(tcg_ctx);
        t1 = tcg_temp_new(tcg_ctx);
        break;
    default:
        t0 = tcg_temp_local_new(tcg_ctx);
        t1 = tcg_temp_local_new(tcg_ctx);
        break;
    }

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    switch (opc) {
    case OPC_MULT_G_2E:
    case OPC_MULT_G_2F:
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_MULTU_G_2E:
    case OPC_MULTU_G_2F:
        tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
        tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_DIV_G_2E:
    case OPC_DIV_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, INT_MIN, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1, l2);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_DIVU_G_2E:
    case OPC_DIVU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l2);
        }
        break;
    case OPC_MOD_G_2E:
    case OPC_MOD_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, t1, 0, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, INT_MIN, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_MODU_G_2E:
    case OPC_MODU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l2);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DMULT_G_2E:
    case OPC_DMULT_G_2F:
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case OPC_DMULTU_G_2E:
    case OPC_DMULTU_G_2F:
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case OPC_DDIV_G_2E:
    case OPC_DDIV_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, -1LL << 63, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1LL, l2);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_DDIVU_G_2E:
    case OPC_DDIVU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l2);
        }
        break;
    case OPC_DMOD_G_2E:
    case OPC_DMOD_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, t1, 0, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, -1LL << 63, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1LL, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_DMODU_G_2E:
    case OPC_DMODU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l2);
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}